

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_signed_int_with_string(void)

{
  error *ex_3;
  undefined1 local_23b;
  undefined1 local_23a [2];
  undefined1 local_238 [8];
  variable data_3;
  int input_3;
  error *ex_2;
  undefined1 local_19b;
  undefined1 local_19a [2];
  undefined1 local_198 [8];
  variable data_2;
  int input_2;
  error *ex_1;
  undefined1 local_fb;
  undefined1 local_fa [2];
  undefined1 local_f8 [8];
  variable data_1;
  int input_1;
  error *ex;
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  int input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x280,"void append_suite::append_signed_int_with_string()",local_4a,&local_4b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_48,
             (basic_variable<std::allocator<char>_> *)&ex);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(\"alpha\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x283,"void append_suite::append_signed_int_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  data_1.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_f8,2);
  local_fa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_f8);
  local_fb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x289,"void append_suite::append_signed_int_with_string()",local_fa,&local_fb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_f8,
             (basic_variable<std::allocator<char>_> *)&ex_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(L\"bravo\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x28c,"void append_suite::append_signed_int_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_f8);
  data_2.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_198,2);
  local_19a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_198);
  local_19b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x292,"void append_suite::append_signed_int_with_string()",local_19a,&local_19b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_2,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_198,
             (basic_variable<std::allocator<char>_> *)&ex_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_2);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(u\"charlie\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x295,"void append_suite::append_signed_int_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_198);
  data_3.storage._40_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_238,2);
  local_23a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_238);
  local_23b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x29b,"void append_suite::append_signed_int_with_string()",local_23a,&local_23b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_238,
             (basic_variable<std::allocator<char>_> *)&ex_3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_3);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(variable(U\"delta\"))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x29e,"void append_suite::append_signed_int_with_string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_238);
  return;
}

Assistant:

void append_signed_int_with_string()
{
    // signed - string
    {
        signed int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable("alpha")),
                                        error,
                                        "incompatible type");
    }
    // signed - wstring
    {
        signed int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(L"bravo")),
                                        error,
                                        "incompatible type");
    }
    // signed - u16string
    {
        signed int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(u"charlie")),
                                        error,
                                        "incompatible type");
    }
    // signed - u32string
    {
        signed int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(variable(U"delta")),
                                        error,
                                        "incompatible type");
    }
}